

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<int> *this,Recycler *recycler,
          DictionaryTypeHandlerBase<int> *typeHandler)

{
  DictionaryTypeHandlerBase<int> *this_00;
  Recycler *alloc;
  IndexPropertyDescriptorMap *this_01;
  TrackAllocData local_48;
  DictionaryTypeHandlerBase<int> *local_20;
  DictionaryTypeHandlerBase<int> *typeHandler_local;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  local_20 = typeHandler;
  typeHandler_local = (DictionaryTypeHandlerBase<int> *)recycler;
  recycler_local = (Recycler *)this;
  DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<int>,typeHandler);
  (this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler._vptr_DynamicTypeHandler =
       (_func_int **)&PTR_GetCppName_01e471e8;
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::WriteBarrierPtr(&this->indexPropertyMap);
  this_00 = typeHandler_local;
  this->dataItemAttributes = '\a';
  this->lengthWritable = true;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&IndexPropertyDescriptorMap::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
             ,0xed);
  alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_48);
  this_01 = (IndexPropertyDescriptorMap *)new<Memory::Recycler>(0x20,alloc,0x43c4b0);
  IndexPropertyDescriptorMap::IndexPropertyDescriptorMap(this_01,(Recycler *)typeHandler_local);
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator=
            (&this->indexPropertyMap,this_01);
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler, DictionaryTypeHandlerBase<T>* typeHandler)
        : DictionaryTypeHandlerBase<T>(typeHandler), dataItemAttributes(PropertyDynamicTypeDefaults), lengthWritable(true)
    {
        indexPropertyMap = RecyclerNew(recycler, IndexPropertyDescriptorMap, recycler);
    }